

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O0

void __thiscall
VarnodeListSymbol::getFixedHandle(VarnodeListSymbol *this,FixedHandle *hand,ParserWalker *walker)

{
  PatternValue *pPVar1;
  uint uVar2;
  const_reference ppVVar3;
  VarnodeData *pVVar4;
  VarnodeData *fix;
  uint4 ind;
  ParserWalker *walker_local;
  FixedHandle *hand_local;
  VarnodeListSymbol *this_local;
  
  pPVar1 = (this->super_ValueSymbol).patval;
  uVar2 = (*(pPVar1->super_PatternExpression)._vptr_PatternExpression[2])(pPVar1,walker);
  ppVVar3 = std::vector<VarnodeSymbol_*,_std::allocator<VarnodeSymbol_*>_>::operator[]
                      (&this->varnode_table,(ulong)uVar2);
  pVVar4 = VarnodeSymbol::getFixedVarnode(*ppVVar3);
  hand->space = pVVar4->space;
  hand->offset_space = (AddrSpace *)0x0;
  hand->offset_offset = pVVar4->offset;
  hand->size = pVVar4->size;
  return;
}

Assistant:

void VarnodeListSymbol::getFixedHandle(FixedHandle &hand,ParserWalker &walker) const

{
  uint4 ind = (uint4) patval->getValue(walker);
  // The resolve routine has checked that -ind- must be a valid index
  const VarnodeData &fix( varnode_table[ind]->getFixedVarnode() );
  hand.space = fix.space;
  hand.offset_space = (AddrSpace *)0; // Not a dynamic value
  hand.offset_offset = fix.offset;
  hand.size = fix.size;
}